

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall pbrt::Image::Image(Image *this,Image *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  ColorEncodingHandle *in_stack_ffffffffffffff58;
  polymorphic_allocator<pbrt::Half> *in_stack_ffffffffffffff60;
  polymorphic_allocator<unsigned_char> *in_stack_ffffffffffffff70;
  polymorphic_allocator<pbrt::Half> *alloc;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_00;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_38;
  undefined8 *local_10;
  
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 1);
  *in_RDI = *in_RSI;
  local_10 = in_RSI;
  pstd::pmr::
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::polymorphic_allocator
            ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff60);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffff70);
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pstd::pmr::polymorphic_allocator<unsigned_char>::polymorphic_allocator
            ((polymorphic_allocator<unsigned_char> *)in_stack_ffffffffffffff60);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff80,
             (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  alloc = (polymorphic_allocator<pbrt::Half> *)(in_RDI + 0x1b);
  other = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(local_10 + 0x1b);
  this_00 = &local_38;
  pstd::pmr::polymorphic_allocator<pbrt::Half>::polymorphic_allocator(in_stack_ffffffffffffff60);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
            (this_00,other,alloc);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)(local_10 + 0x1f));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)this_00,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)other,
             (polymorphic_allocator<float> *)alloc);
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}